

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<float,float,float,duckdb::BinaryZeroIsNullWrapper,duckdb::DivideOperator,bool,false,false>
               (float *ldata,float *rdata,float *result_data,idx_t count,ValidityMask *mask,bool fun
               )

{
  ulong *puVar1;
  float fVar2;
  unsigned_long *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  byte bVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  idx_t idx_in_entry;
  ulong uVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  ulong uVar13;
  ulong uVar14;
  unsigned_long uVar15;
  float fVar16;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  idx_t local_80;
  float *local_78;
  float *local_70;
  float *local_68;
  ulong local_60;
  buffer_ptr<ValidityBuffer> *local_58;
  idx_t local_50;
  float *local_48;
  float *local_40;
  ulong local_38;
  
  local_70 = ldata;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar9 = 0;
      do {
        fVar16 = ldata[uVar9];
        fVar2 = rdata[uVar9];
        if ((fVar2 != 0.0) || (NAN(fVar2))) {
          fVar16 = fVar16 / fVar2;
        }
        else {
          if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            local_80 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_98,&local_80);
            p_Var7 = p_Stack_90;
            peVar6 = local_98;
            local_98 = (element_type *)0x0;
            p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar6;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var7;
            if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
            }
            if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
            }
            pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                               (&(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                 (unsigned_long *)
                 (pTVar8->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
            ldata = local_70;
          }
          bVar5 = (byte)uVar9 & 0x3f;
          puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask + (uVar9 >> 6);
          *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
        }
        result_data[uVar9] = fVar16;
        uVar9 = uVar9 + 1;
      } while (count != uVar9);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_60 = count + 0x3f >> 6;
    local_58 = &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    local_38 = 0;
    uVar9 = 0;
    local_78 = result_data;
    local_68 = rdata;
    local_50 = count;
    do {
      pfVar10 = local_68;
      puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar3 == (unsigned_long *)0x0) {
        uVar15 = 0xffffffffffffffff;
      }
      else {
        uVar15 = puVar3[local_38];
      }
      uVar13 = uVar9 + 0x40;
      if (count <= uVar9 + 0x40) {
        uVar13 = count;
      }
      uVar14 = uVar13;
      if (uVar15 != 0) {
        uVar14 = uVar9;
        if (uVar15 == 0xffffffffffffffff) {
          if (uVar9 < uVar13) {
            do {
              fVar16 = ldata[uVar9];
              fVar2 = pfVar10[uVar9];
              if ((fVar2 != 0.0) || (NAN(fVar2))) {
                fVar16 = fVar16 / fVar2;
              }
              else {
                if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                    (unsigned_long *)0x0) {
                  local_80 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_98,&local_80);
                  p_Var7 = p_Stack_90;
                  peVar6 = local_98;
                  local_98 = (element_type *)0x0;
                  p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal
                           .
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar6;
                  (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var7;
                  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
                  }
                  if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                  }
                  pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                           operator->(local_58);
                  (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                       (unsigned_long *)
                       (pTVar8->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                  ldata = local_70;
                }
                bVar5 = (byte)uVar9 & 0x3f;
                puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                         (uVar9 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
              }
              result_data[uVar9] = fVar16;
              uVar9 = uVar9 + 1;
              uVar14 = uVar9;
            } while (uVar13 != uVar9);
          }
        }
        else {
          result_data = local_78;
          if (uVar9 < uVar13) {
            pfVar10 = local_78 + uVar9;
            pfVar12 = local_68 + uVar9;
            uVar14 = 0;
            pfVar11 = ldata;
            local_48 = pfVar12;
            local_40 = pfVar10;
            do {
              if ((uVar15 >> (uVar14 & 0x3f) & 1) != 0) {
                fVar16 = ldata[uVar9 + uVar14];
                fVar2 = pfVar12[uVar14];
                if ((fVar2 != 0.0) || (NAN(fVar2))) {
                  fVar16 = fVar16 / fVar2;
                }
                else {
                  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                      (unsigned_long *)0x0) {
                    local_80 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)&local_98,&local_80);
                    p_Var7 = p_Stack_90;
                    peVar6 = local_98;
                    local_98 = (element_type *)0x0;
                    p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                             internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = peVar6;
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = p_Var7;
                    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
                    }
                    if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                    }
                    pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                             operator->(local_58);
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                         (unsigned_long *)
                         (pTVar8->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>;
                    pfVar10 = local_40;
                    pfVar11 = local_70;
                    pfVar12 = local_48;
                  }
                  bVar5 = (byte)(uVar14 + uVar9) & 0x3f;
                  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                           (uVar14 + uVar9 >> 6);
                  *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
                }
                pfVar10[uVar14] = fVar16;
              }
              uVar14 = uVar14 + 1;
            } while ((uVar9 - uVar13) + uVar14 != 0);
            uVar14 = uVar9 + uVar14;
            ldata = pfVar11;
            result_data = local_78;
            count = local_50;
          }
        }
      }
      local_38 = local_38 + 1;
      uVar9 = uVar14;
    } while (local_38 != local_60);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}